

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t *
containerptr_roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val,uint8_t *type,int *index)

{
  uint uVar1;
  container_t *pcVar2;
  array_container_t *c;
  container_t *c_00;
  uint16_t x;
  uint8_t new_type;
  uint *local_38;
  
  x = (uint16_t)(val >> 0x10);
  local_38 = (uint *)index;
  uVar1 = ra_get_index(&r->high_low_container,x);
  if ((int)uVar1 < 0) {
    c = array_container_create();
    c_00 = container_add(c,(uint16_t)val,'\x02',type);
    ra_insert_new_key_value_at(&r->high_low_container,~uVar1,x,c_00,*type);
    *local_38 = ~uVar1;
  }
  else {
    ra_unshare_container_at_index(&r->high_low_container,(uint16_t)uVar1);
    new_type = (r->high_low_container).typecodes[uVar1 & 0xffff];
    *type = new_type;
    c_00 = (r->high_low_container).containers[uVar1 & 0xffff];
    pcVar2 = container_add(c_00,(uint16_t)val,new_type,&new_type);
    *local_38 = uVar1;
    if (pcVar2 != c_00) {
      container_free(c_00,*type);
      (r->high_low_container).containers[uVar1] = pcVar2;
      (r->high_low_container).typecodes[uVar1] = new_type;
      *type = new_type;
      c_00 = pcVar2;
    }
  }
  return c_00;
}

Assistant:

static inline container_t *containerptr_roaring_bitmap_add(roaring_bitmap_t *r,
                                                           uint32_t val,
                                                           uint8_t *type,
                                                           int *index) {
    roaring_array_t *ra = &r->high_low_container;

    uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    if (i >= 0) {
        ra_unshare_container_at_index(ra, (uint16_t)i);
        container_t *c = ra_get_container_at_index(ra, (uint16_t)i, type);
        uint8_t new_type = *type;
        container_t *c2 = container_add(c, val & 0xFFFF, *type, &new_type);
        *index = i;
        if (c2 != c) {
            container_free(c, *type);
            ra_set_container_at_index(ra, i, c2, new_type);
            *type = new_type;
            return c2;
        } else {
            return c;
        }
    } else {
        array_container_t *new_ac = array_container_create();
        container_t *c =
            container_add(new_ac, val & 0xFFFF, ARRAY_CONTAINER_TYPE, type);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(ra, -i - 1, hb, c, *type);
        *index = -i - 1;
        return c;
    }
}